

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_env_copyfd2(MDB_env *env,int fd,uint flags)

{
  uint flags_local;
  int fd_local;
  MDB_env *env_local;
  
  if ((flags & 1) == 0) {
    env_local._4_4_ = mdb_env_copyfd0(env,fd);
  }
  else {
    env_local._4_4_ = mdb_env_copyfd1(env,fd);
  }
  return env_local._4_4_;
}

Assistant:

int ESECT
mdb_env_copyfd2(MDB_env *env, HANDLE fd, unsigned int flags)
{
	if (flags & MDB_CP_COMPACT)
		return mdb_env_copyfd1(env, fd);
	else
		return mdb_env_copyfd0(env, fd);
}